

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::removeBrackets_abi_cxx11_(string_view str)

{
  uchar uVar1;
  bool bVar2;
  uchar uVar3;
  reference pvVar4;
  uchar *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  string *newString;
  uchar in_stack_ffffffffffffff9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  __pos = in_RDI;
  trim_abi_cxx11_(in_stack_00000020,(string_view)in_stack_00000010);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x77fe04);
  if ((!bVar2) &&
     ((((pvVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front(in_RDI),
        *pvVar4 == '[' ||
        (pvVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front(in_RDI),
        *pvVar4 == '(')) ||
       (pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front(in_RDI),
       *pvVar4 == '{')) ||
      (pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::front(in_RDI), *pvVar4 == '<')))) {
    puVar5 = (uchar *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                (in_RDI);
    uVar1 = *puVar5;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
              (in_RDI);
    uVar3 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)in_RDI,in_stack_ffffffffffffff9f);
    if (uVar1 == uVar3) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (in_RDI);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_ffffffffffffffb0,(size_type)__pos,(size_type)in_RDI);
    }
  }
  return (string *)in_RDI;
}

Assistant:

std::string removeBrackets(std::string_view str)
    {
        std::string newString = trim(str);
        if (!newString.empty()) {
            if ((newString.front() == '[') || (newString.front() == '(') ||
                (newString.front() == '{') || (newString.front() == '<')) {
                if (static_cast<unsigned char>(newString.back()) ==
                    pmap[newString.front()]) {
                    newString.pop_back();
                    newString.erase(0, 1);
                }
            }
        }
        return newString;
    }